

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

bool __thiscall
ON_Mesh::IsValidNewNgonInformation
          (ON_Mesh *this,uint Vcount,uint *ngon_vi,uint Fcount,uint *ngon_fi)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  bool bVar4;
  
  if (2 < Vcount) {
    uVar1 = (this->m_F).m_count;
    uVar3 = 0;
    do {
      if (Vcount == uVar3) {
        if (Fcount == 0) {
          puVar2 = (uint *)0x0;
        }
        else {
          puVar2 = NgonMap(this);
        }
        uVar3 = 0;
        while( true ) {
          bVar4 = Fcount == uVar3;
          if (bVar4) {
            return bVar4;
          }
          if (uVar1 <= ngon_fi[uVar3]) break;
          if ((puVar2 != (uint *)0x0) && (puVar2[ngon_fi[uVar3]] != 0xffffffff)) {
            return bVar4;
          }
          uVar3 = uVar3 + 1;
        }
        return bVar4;
      }
      puVar2 = ngon_vi + uVar3;
      uVar3 = uVar3 + 1;
    } while (*puVar2 < (uint)(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count);
  }
  return false;
}

Assistant:

bool ON_Mesh::IsValidNewNgonInformation(
  unsigned int Vcount, 
  const unsigned int* ngon_vi,
  unsigned int Fcount, 
  const unsigned int* ngon_fi
  ) const
{
  unsigned int i;
  const unsigned int meshVcount = m_V.UnsignedCount();
  const unsigned int meshFcount = m_F.UnsignedCount();
  if ( Vcount < 3 )
    return false;

  for ( i = 0; i < Vcount; i++ )
  {
    if ( ngon_vi[i] >= meshVcount )
      return false;
  }

  const unsigned int* ngon_map = (Fcount > 0) ? NgonMap() : 0;

  for ( i = 0; i < Fcount; i++ )
  {
    if ( ngon_fi[i] >= meshFcount )
      return false;
    if ( ngon_map && ON_UNSET_UINT_INDEX != ngon_map[ngon_fi[i]] )
      return false;
  }

  return true;
}